

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

int Nwk_ManLevelMax(Nwk_Man_t *pNtk)

{
  int iVar1;
  Nwk_Obj_t *p;
  int local_20;
  int local_1c;
  int LevelMax;
  int i;
  Nwk_Obj_t *pObj;
  Nwk_Man_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vCos), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCos,local_1c);
    iVar1 = Nwk_ObjIsPo(p);
    if ((iVar1 != 0) && (iVar1 = Nwk_ObjLevel(p), local_20 < iVar1)) {
      local_20 = Nwk_ObjLevel(p);
    }
  }
  return local_20;
}

Assistant:

int Nwk_ManLevelMax( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int i, LevelMax = 0;
    Nwk_ManForEachPo( pNtk, pObj, i )
        if ( LevelMax < Nwk_ObjLevel(pObj) )
            LevelMax = Nwk_ObjLevel(pObj);
    return LevelMax;
}